

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O0

EnumerationConstraint * __thiscall
Clasp::CBConsequences::doInit
          (CBConsequences *this,SharedContext *ctx,SharedMinimizeData *m,int param_4)

{
  SharedQueue *pSVar1;
  bool bVar2;
  ProjectMode PVar3;
  uint32 uVar4;
  lit_iterator pLVar5;
  iterator pLVar6;
  uint32 *puVar7;
  SharedContext *sh;
  EnumerationConstraint *pEVar8;
  long in_RDX;
  SharedContext *in_RSI;
  Enumerator *in_RDI;
  iterator end_3;
  iterator it_3;
  uint32 vMask;
  uint32 fMask;
  lit_iterator end_2;
  lit_iterator it_2;
  range_iterator end_1;
  range_iterator it_1;
  pred_iterator end;
  pred_iterator it;
  OutputTable *out;
  SharedContext *in_stack_fffffffffffffed8;
  SharedContext *in_stack_fffffffffffffee0;
  Value in_stack_fffffffffffffee8;
  Var in_stack_fffffffffffffeec;
  Solver *in_stack_fffffffffffffef0;
  CBConsequences *in_stack_fffffffffffffef8;
  SharedContext *in_stack_ffffffffffffff00;
  Solver *in_stack_ffffffffffffff10;
  Var in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  SharedContext *in_stack_ffffffffffffff20;
  bool local_c9;
  Literal *local_80;
  lit_iterator local_60;
  num_iterator<unsigned_int> local_54;
  num_iterator<unsigned_int> local_50;
  uint32 local_4c;
  pred_iterator local_48;
  pred_iterator local_40;
  uint32 local_34;
  Output *local_30;
  long local_20;
  SharedContext *local_18;
  EnumerationConstraint *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 1));
  local_30 = &local_18->output;
  PVar3 = OutputTable::projectMode((OutputTable *)in_stack_fffffffffffffee0);
  if (PVar3 == Output) {
    uVar4 = OutputTable::numFacts((OutputTable *)0x2277c3);
    if (uVar4 != 0) {
      local_34 = (uint32)lit_true();
      addLit(in_stack_fffffffffffffef8,(SharedContext *)in_stack_fffffffffffffef0,
             (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    }
    local_40 = OutputTable::pred_begin((OutputTable *)0x227804);
    local_48 = OutputTable::pred_end((OutputTable *)0x227819);
    for (; local_40 != local_48; local_40 = local_40 + 1) {
      local_4c = (local_40->cond).rep_;
      addLit(in_stack_fffffffffffffef8,(SharedContext *)in_stack_fffffffffffffef0,
             (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    }
    local_50.val_ = (uint)OutputTable::vars_begin((OutputTable *)in_stack_fffffffffffffed8);
    local_54.val_ = (uint)OutputTable::vars_end((OutputTable *)in_stack_fffffffffffffed8);
    while (bVar2 = num_iterator<unsigned_int>::operator!=(&local_50,&local_54), bVar2) {
      num_iterator<unsigned_int>::operator*(&local_50);
      posLit(0x2278d8);
      addLit(in_stack_fffffffffffffef8,(SharedContext *)in_stack_fffffffffffffef0,
             (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      num_iterator<unsigned_int>::operator++(&local_50);
    }
  }
  else {
    local_60 = OutputTable::proj_begin((OutputTable *)0x227913);
    pLVar5 = OutputTable::proj_end((OutputTable *)0x227928);
    for (; local_60 != pLVar5; local_60 = local_60 + 1) {
      addLit(in_stack_fffffffffffffef8,(SharedContext *)in_stack_fffffffffffffef0,
             (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    }
  }
  if (((local_20 != 0) &&
      (bVar2 = SharedMinimizeData::optimize((SharedMinimizeData *)in_stack_fffffffffffffee0), bVar2)
      ) && (*(int *)((long)&in_RDI[1].values_.ebo_.buf + 4) == 1)) {
    SharedContext::warn(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    *(undefined4 *)((long)&in_RDI[1].values_.ebo_.buf + 4) = 0;
  }
  local_c9 = false;
  if (*(int *)&in_RDI[1].values_.ebo_.buf == 2) {
    local_c9 = *(int *)((long)&in_RDI[1].values_.ebo_.buf + 4) != 1;
  }
  local_80 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 1))
  ;
  pLVar6 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 1));
  for (; uVar4 = (uint32)((ulong)in_stack_ffffffffffffff10 >> 0x20), local_80 != pLVar6;
      local_80 = local_80 + 1) {
    in_stack_ffffffffffffff1c = (uint)local_c9;
    puVar7 = Literal::rep(local_80);
    *puVar7 = in_stack_ffffffffffffff1c | *puVar7;
    in_stack_ffffffffffffff20 = local_18;
    Literal::var(local_80);
    SharedContext::unmark(in_stack_fffffffffffffee0,(Var)((ulong)in_stack_fffffffffffffed8 >> 0x20))
    ;
    Literal::var(local_80);
    SharedContext::varInfo(in_stack_fffffffffffffed8,0);
    bVar2 = VarInfo::nant((VarInfo *)0x227ae6);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff10 = SharedContext::master((SharedContext *)0x227afb);
      in_stack_ffffffffffffff18 = Literal::var(local_80);
      trueValue((Literal *)0x227b1e);
      Solver::setPref(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                      (ValueRep)((ulong)in_stack_fffffffffffffee0 >> 0x38));
    }
  }
  pSVar1 = in_RDI[1].queue_;
  if (pSVar1 != (SharedQueue *)0x0) {
    SharedConstraint::~SharedConstraint((SharedConstraint *)in_stack_fffffffffffffee0);
    operator_delete(pSVar1);
  }
  in_RDI[1].queue_ = (SharedQueue *)0x0;
  Enumerator::setIgnoreSymmetric(in_RDI,true);
  if ((*(int *)&in_RDI[1].values_.ebo_.buf == 2) &&
     (*(int *)((long)&in_RDI[1].values_.ebo_.buf + 4) == 1)) {
    pEVar8 = (EnumerationConstraint *)operator_new(0x60);
    SharedContext::numVars((SharedContext *)0x227cdf);
    QueryFinder::QueryFinder
              ((QueryFinder *)in_stack_ffffffffffffff20,
               (LitVec *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),uVar4);
    local_8 = pEVar8;
  }
  else {
    uVar4 = SharedContext::concurrency(local_18);
    if (uVar4 < 2) {
      sh = (SharedContext *)0x0;
    }
    else {
      sh = (SharedContext *)operator_new(0x10);
      SharedConstraint::SharedConstraint((SharedConstraint *)0x227c02);
      in_stack_ffffffffffffff00 = sh;
    }
    in_RDI[1].queue_ = (SharedQueue *)sh;
    pEVar8 = (EnumerationConstraint *)operator_new(0x70);
    CBFinder::CBFinder((CBFinder *)in_stack_ffffffffffffff00,(SharedCon *)sh);
    local_8 = pEVar8;
  }
  return local_8;
}

Assistant:

EnumerationConstraint* CBConsequences::doInit(SharedContext& ctx, SharedMinimizeData* m, int) {
	cons_.clear();
	const OutputTable& out = ctx.output;
	if (out.projectMode() == ProjectMode_t::Output) {
		if (out.numFacts()) {
			addLit(ctx, lit_true());
		}
		for (OutputTable::pred_iterator it = out.pred_begin(), end = out.pred_end(); it != end; ++it) {
			addLit(ctx, it->cond);
		}
		for (OutputTable::range_iterator it = out.vars_begin(), end = out.vars_end(); it != end; ++it) {
			addLit(ctx, posLit(*it));
		}
	}
	else {
		for (OutputTable::lit_iterator it = out.proj_begin(), end = out.proj_end(); it != end; ++it) {
			addLit(ctx, *it);
		}
	}
	if (m && m->optimize() && algo_ == Query) {
		ctx.warn("Query algorithm does not support optimization!");
		algo_ = Default;
	}
	// init M to either cons or {} depending on whether we compute cautious or brave cons.
	const uint32 fMask = (type_ == Cautious && algo_ != Query);
	const uint32 vMask = (type_ == Cautious) ? 3u : 0u;
	for (LitVec::iterator it = cons_.begin(), end = cons_.end(); it != end; ++it) {
		it->rep() |= fMask;
		ctx.unmark(it->var());
		if (!ctx.varInfo(it->var()).nant()) {
			ctx.master()->setPref(it->var(), ValueSet::def_value, static_cast<ValueRep>(trueValue(*it) ^ vMask));
		}
	}
	delete shared_; shared_ = 0;
	setIgnoreSymmetric(true);
	if (type_ != Cautious || algo_ != Query) {
		shared_ = ctx.concurrency() > 1 ? new SharedConstraint() : 0;
		return new CBFinder(shared_);
	}
	return new QueryFinder(cons_, ctx.numVars() + 1);
}